

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  ~DescriptorProto(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.DescriptorProto)
  SharedDtor();
}